

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

xmlChar * xmlStrstr(xmlChar *str,xmlChar *val)

{
  int len;
  int iVar1;
  int n;
  xmlChar *val_local;
  xmlChar *str_local;
  
  if (str == (xmlChar *)0x0) {
    str_local = (xmlChar *)0x0;
  }
  else if (val == (xmlChar *)0x0) {
    str_local = (xmlChar *)0x0;
  }
  else {
    len = xmlStrlen(val);
    val_local = str;
    str_local = str;
    if (len != 0) {
      for (; *val_local != '\0'; val_local = val_local + 1) {
        if ((*val_local == *val) && (iVar1 = xmlStrncmp(val_local,val,len), iVar1 == 0)) {
          return val_local;
        }
      }
      str_local = (xmlChar *)0x0;
    }
  }
  return str_local;
}

Assistant:

const xmlChar *
xmlStrstr(const xmlChar *str, const xmlChar *val) {
    int n;

    if (str == NULL) return(NULL);
    if (val == NULL) return(NULL);
    n = xmlStrlen(val);

    if (n == 0) return(str);
    while (*str != 0) { /* non input consuming */
        if (*str == *val) {
            if (!xmlStrncmp(str, val, n)) return((const xmlChar *) str);
        }
        str++;
    }
    return(NULL);
}